

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectricityBill.h
# Opt level: O1

void __thiscall RoomInfo::RoomInfo(RoomInfo *this,string *flat,string *room)

{
  pointer pcVar1;
  
  (this->flatname)._M_dataplus._M_p = (pointer)&(this->flatname).field_2;
  pcVar1 = (flat->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + flat->_M_string_length);
  (this->roomname)._M_dataplus._M_p = (pointer)&(this->roomname).field_2;
  pcVar1 = (room->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->roomname,pcVar1,pcVar1 + room->_M_string_length);
  return;
}

Assistant:

RoomInfo(const std::string& flat, const std::string& room):
			flatname(flat),
			roomname(room)
	{

	}